

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.cpp
# Opt level: O2

bool Jupiter_isBase64(char *in)

{
  char cVar1;
  
  do {
    cVar1 = *in;
    if ((long)cVar1 == 0) break;
    in = in + 1;
  } while ("BBBBBBBBB@BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB>BBB?456789:;<=BBBABBB"[cVar1] != 'B');
  return cVar1 == '\0';
}

Assistant:

bool Jupiter_isBase64(const char *in)
{
	while (*in != 0)
	{
		switch (Jupiter_base64DecodeTable[*in++])
		{
		case 66:
			return false;
		default:
			break;
		}
	}
	return true;
}